

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O3

DataPiece *
google::protobuf::util::converter::DefaultValueObjectWriter::FindEnumDefault
          (DataPiece *__return_storage_ptr__,Field *field,TypeInfo *typeinfo,bool use_ints_for_enums
          )

{
  int32 iVar1;
  string *psVar2;
  size_t sVar3;
  pointer pcVar4;
  int64 *piVar5;
  int64 iVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  LogMessage *pLVar10;
  undefined7 in_register_00000009;
  LogMessage local_70;
  undefined4 local_38;
  LogFinisher local_31;
  long lVar9;
  
  psVar2 = (field->default_value_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    pcVar4 = (psVar2->_M_dataplus)._M_p;
    if ((long)sVar3 < 0) {
      StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_STRING;
    (__return_storage_ptr__->field_2).i64_ = (int64)pcVar4;
    (__return_storage_ptr__->field_2).str_.size_ = sVar3;
LAB_003095dc:
    bVar7 = true;
    goto LAB_003096d3;
  }
  local_38 = (undefined4)CONCAT71(in_register_00000009,use_ints_for_enums);
  psVar2 = (field->type_url_).ptr_;
  pcVar4 = (psVar2->_M_dataplus)._M_p;
  sVar3 = psVar2->_M_string_length;
  if ((long)sVar3 < 0) {
    StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
  }
  iVar8 = (*typeinfo->_vptr_TypeInfo[4])(typeinfo,pcVar4,sVar3);
  lVar9 = CONCAT44(extraout_var,iVar8);
  if (lVar9 == 0) {
    protobuf::internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_WARNING,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O3/src/src/google/protobuf/util/internal/default_value_objectwriter.cc"
               ,0x1a6);
    pLVar10 = protobuf::internal::LogMessage::operator<<
                        (&local_70,"Could not find enum with type \'");
    pLVar10 = protobuf::internal::LogMessage::operator<<(pLVar10,(field->type_url_).ptr_);
    pLVar10 = protobuf::internal::LogMessage::operator<<(pLVar10,"\'");
    protobuf::internal::LogFinisher::operator=(&local_31,pLVar10);
    protobuf::internal::LogMessage::~LogMessage(&local_70);
LAB_003096b5:
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_NULL;
    (__return_storage_ptr__->field_2).i32_ = 0;
  }
  else {
    if (*(int *)(lVar9 + 0x18) < 1) goto LAB_003096b5;
    lVar9 = *(long *)(*(long *)(lVar9 + 0x20) + 8);
    if ((char)local_38 == '\0') {
      piVar5 = *(int64 **)(lVar9 + 0x28);
      iVar6 = *piVar5;
      sVar3 = piVar5[1];
      if ((long)sVar3 < 0) {
        StringPiece::LogFatalSizeTooBig(sVar3,"size_t to int conversion");
      }
      __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
      __return_storage_ptr__->type_ = TYPE_STRING;
      (__return_storage_ptr__->field_2).i64_ = iVar6;
      (__return_storage_ptr__->field_2).str_.size_ = sVar3;
      goto LAB_003095dc;
    }
    iVar1 = *(int32 *)(lVar9 + 0x30);
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003bcd00;
    __return_storage_ptr__->type_ = TYPE_INT32;
    (__return_storage_ptr__->field_2).i32_ = iVar1;
  }
  bVar7 = false;
LAB_003096d3:
  __return_storage_ptr__->use_strict_base64_decoding_ = bVar7;
  return __return_storage_ptr__;
}

Assistant:

DataPiece DefaultValueObjectWriter::FindEnumDefault(
    const google::protobuf::Field& field, const TypeInfo* typeinfo,
    bool use_ints_for_enums) {
  if (!field.default_value().empty())
    return DataPiece(field.default_value(), true);

  const google::protobuf::Enum* enum_type =
      typeinfo->GetEnumByTypeUrl(field.type_url());
  if (!enum_type) {
    GOOGLE_LOG(WARNING) << "Could not find enum with type '" << field.type_url()
                 << "'";
    return DataPiece::NullData();
  }
  // We treat the first value as the default if none is specified.
  return enum_type->enumvalue_size() > 0
             ? (use_ints_for_enums
                    ? DataPiece(enum_type->enumvalue(0).number())
                    : DataPiece(enum_type->enumvalue(0).name(), true))
             : DataPiece::NullData();
}